

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

word * Gla_ObjTruthNode(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  pwVar3 = Vec_WrdArray(p->vTtMemory);
  iVar1 = p->nTtWords;
  iVar2 = Gia_ObjNum(p,pObj);
  return pwVar3 + iVar1 * iVar2;
}

Assistant:

static inline word * Gla_ObjTruthNode( Gia_Man_t * p, Gia_Obj_t * pObj ) { return Vec_WrdArray(p->vTtMemory) + p->nTtWords * Gia_ObjNum(p, pObj);                    }